

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> * __thiscall
llvm::AppleAcceleratorTable::equal_range
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          AppleAcceleratorTable *this,StringRef Key)

{
  SmallVectorStorage<llvm::DWARFFormValue,_3U> *pSVar1;
  SmallVectorStorage<llvm::DWARFFormValue,_3U> *pSVar2;
  uint uVar3;
  uint64_t this_00;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  char *__s;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ValueIterator local_558;
  ValueIterator local_490;
  ValueIterator local_3c8;
  ValueIterator local_300;
  ValueIterator local_238;
  ValueIterator local_170;
  uint64_t local_a8;
  uint64_t BucketOffset;
  uint64_t HashOffset;
  uint64_t OffsetsOffset;
  uint64_t StringOffset;
  long local_80;
  long local_78;
  size_t local_70;
  DataExtractor *local_68;
  char *local_60;
  _func_int **local_58;
  ulong local_50;
  uint64_t DataOffset;
  iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *local_40;
  _func_int **local_38;
  
  sVar8 = Key.Length;
  local_60 = Key.Data;
  if (this->IsValid == false) {
    memset(&local_3c8,0,200);
    pSVar1 = &local_3c8.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_3c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_3c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_3c8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01097e10;
    local_3c8.Current.HdrData = (HeaderData *)0x0;
    local_3c8.DataOffset = 0;
    local_3c8.Data = 0;
    local_3c8.NumData = 0;
    local_3c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         pSVar1;
    memset(&local_558,0,200);
    pSVar2 = &local_558.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_558.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_558.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_558.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01097e10;
    local_558.Current.HdrData = (HeaderData *)0x0;
    local_558.DataOffset = 0;
    local_558.Data = 0;
    local_558.NumData = 0;
    local_558.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         pSVar2;
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              (__return_storage_ptr__,&local_3c8,&local_558);
    local_558.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
    if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
        local_558.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
        pSVar2) {
      free(local_558.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX)
      ;
    }
    local_3c8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
    if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
        local_3c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
        pSVar1) {
      free(local_3c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX)
      ;
    }
  }
  else {
    if (sVar8 == 0) {
      uVar4 = 0x1505;
    }
    else {
      uVar4 = 0x1505;
      sVar9 = 0;
      do {
        uVar4 = uVar4 * 0x21 + (uint)(byte)local_60[sVar9];
        sVar9 = sVar9 + 1;
      } while (sVar8 != sVar9);
    }
    uVar3 = (this->Hdr).BucketCount;
    uVar6 = (this->Hdr).HashCount;
    StringOffset = (ulong)uVar4 % (ulong)uVar3;
    uVar13 = (ulong)(this->Hdr).HeaderDataLength;
    local_a8 = uVar13 + 0x14 + (ulong)(uint)((int)StringOffset * 4);
    DataOffset = (uint64_t)&(this->super_DWARFAcceleratorTable).AccelSection;
    local_40 = __return_storage_ptr__;
    uVar5 = DataExtractor::getU32((DataExtractor *)DataOffset,&local_a8,(Error *)0x0);
    if (uVar5 < (this->Hdr).HashCount) {
      local_80 = uVar13 + (uVar3 << 2) + 0x14;
      lVar11 = (ulong)(uVar6 << 2) + local_80;
      local_68 = &(this->super_DWARFAcceleratorTable).StringSection;
      uVar10 = (ulong)uVar5;
      uVar13 = uVar10 * 4;
      local_58 = (_func_int **)&PTR_getCUOffset_01097e10;
      local_38 = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
      local_78 = lVar11;
      local_70 = sVar8;
      do {
        BucketOffset = local_80 + (uVar13 & 0xffffffff);
        HashOffset = (uVar13 & 0xffffffff) + lVar11;
        uVar6 = DataExtractor::getU32((DataExtractor *)DataOffset,&BucketOffset,(Error *)0x0);
        this_00 = DataOffset;
        iVar12 = 2;
        if (uVar6 % (this->Hdr).BucketCount == (uint)StringOffset) {
          uVar6 = DataExtractor::getU32((DataExtractor *)DataOffset,&HashOffset,(Error *)0x0);
          local_50 = (ulong)uVar6;
          OffsetsOffset =
               DWARFDataExtractor::getRelocatedValue
                         ((DWARFDataExtractor *)this_00,4,&local_50,(uint64_t *)0x0,(Error *)0x0);
          if (OffsetsOffset == 0) {
            iVar12 = 2;
            lVar11 = local_78;
          }
          else {
            __s = DataExtractor::getCStr(local_68,&OffsetsOffset);
            if (__s == (char *)0x0) {
              sVar8 = 0;
            }
            else {
              sVar8 = strlen(__s);
            }
            iVar12 = 0;
            lVar11 = local_78;
            if ((sVar8 == local_70) &&
               ((sVar8 == 0 || (iVar7 = bcmp(local_60,__s,sVar8), lVar11 = local_78, iVar7 == 0))))
            {
              ValueIterator::ValueIterator(&local_238,this,local_50);
              memset(&local_170,0,200);
              pSVar1 = &local_170.Current.super_Entry.Values.
                        super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
              local_170.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
              super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size
                   = 0;
              local_170.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
              super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
              Capacity = 3;
              local_170.Current.super_Entry._vptr_Entry = local_58;
              local_170.Current.HdrData = (HeaderData *)0x0;
              local_170.DataOffset = 0;
              local_170.Data = 0;
              local_170.NumData = 0;
              local_170.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
              super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
              BeginX = pSVar1;
              make_range<llvm::AppleAcceleratorTable::ValueIterator>(local_40,&local_238,&local_170)
              ;
              local_170.Current.super_Entry._vptr_Entry = local_38;
              if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
                  local_170.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
                  BeginX != pSVar1) {
                free(local_170.Current.super_Entry.Values.
                     super_SmallVectorImpl<llvm::DWARFFormValue>.
                     super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                     super_SmallVectorBase.BeginX);
              }
              local_238.Current.super_Entry._vptr_Entry = local_38;
              iVar12 = 1;
              lVar11 = local_78;
              if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
                  local_238.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
                  BeginX != &local_238.Current.super_Entry.Values.
                             super_SmallVectorStorage<llvm::DWARFFormValue,_3U>) {
                free(local_238.Current.super_Entry.Values.
                     super_SmallVectorImpl<llvm::DWARFFormValue>.
                     super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                     super_SmallVectorBase.BeginX);
                lVar11 = local_78;
              }
            }
          }
        }
        if (iVar12 != 0) goto LAB_00d60ce2;
        uVar10 = uVar10 + 1;
        uVar13 = uVar13 + 4;
      } while (uVar10 < (this->Hdr).HashCount);
      iVar12 = 2;
LAB_00d60ce2:
      if (iVar12 != 2) {
        return local_40;
      }
    }
    memset(&local_300,0,200);
    pSVar1 = &local_300.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_300.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_300.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_300.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01097e10;
    local_300.Current.HdrData = (HeaderData *)0x0;
    local_300.DataOffset = 0;
    local_300.Data = 0;
    local_300.NumData = 0;
    local_300.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         pSVar1;
    memset(&local_490,0,200);
    pSVar2 = &local_490.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_490.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_490.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_490.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01097e10;
    local_490.Current.HdrData = (HeaderData *)0x0;
    local_490.DataOffset = 0;
    local_490.Data = 0;
    local_490.NumData = 0;
    local_490.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         pSVar2;
    make_range<llvm::AppleAcceleratorTable::ValueIterator>(local_40,&local_300,&local_490);
    local_490.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
    if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
        local_490.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
        pSVar2) {
      free(local_490.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX)
      ;
    }
    local_300.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
    __return_storage_ptr__ = local_40;
    if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
        local_300.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
        pSVar1) {
      free(local_300.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX)
      ;
      __return_storage_ptr__ = local_40;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

iterator_range<AppleAcceleratorTable::ValueIterator>
AppleAcceleratorTable::equal_range(StringRef Key) const {
  if (!IsValid)
    return make_range(ValueIterator(), ValueIterator());

  // Find the bucket.
  unsigned HashValue = djbHash(Key);
  unsigned Bucket = HashValue % Hdr.BucketCount;
  uint64_t BucketBase = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = BucketBase + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  uint64_t BucketOffset = BucketBase + Bucket * 4;
  unsigned Index = AccelSection.getU32(&BucketOffset);

  // Search through all hashes in the bucket.
  for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
    uint64_t HashOffset = HashesBase + HashIdx * 4;
    uint64_t OffsetsOffset = OffsetsBase + HashIdx * 4;
    uint32_t Hash = AccelSection.getU32(&HashOffset);

    if (Hash % Hdr.BucketCount != Bucket)
      // We are already in the next bucket.
      break;

    uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
    uint64_t StringOffset = AccelSection.getRelocatedValue(4, &DataOffset);
    if (!StringOffset)
      break;

    // Finally, compare the key.
    if (Key == StringSection.getCStr(&StringOffset))
      return make_range({*this, DataOffset}, ValueIterator());
  }
  return make_range(ValueIterator(), ValueIterator());
}